

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O1

_Bool Mips64_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,uint64_t address,
                void *info)

{
  _Bool isBigEndian;
  int feature;
  cs_detail *pcVar1;
  DecodeStatus DVar2;
  undefined8 in_RAX;
  cs_struct *handle;
  uint32_t Insn;
  uint32_t local_34;
  
  local_34 = (uint32_t)((ulong)in_RAX >> 0x20);
  if (code_len < 4) {
    return false;
  }
  feature = *(int *)(ud + 4);
  isBigEndian = *(_Bool *)(ud + 0x28);
  pcVar1 = instr->flat_insn->detail;
  if (pcVar1 != (cs_detail *)0x0) {
    memset(pcVar1,0,0x5f8);
  }
  readInstruction32(code,&local_34,isBigEndian,false);
  pcVar1 = instr->flat_insn->detail;
  if (pcVar1 != (cs_detail *)0x0) {
    memset(pcVar1,0,0x5f8);
  }
  DVar2 = decodeInstruction(DecoderTableMips6432,instr,local_34,address,(MCRegisterInfo *)info,
                            feature);
  if ((DVar2 == MCDisassembler_Fail) &&
     (DVar2 = decodeInstruction(DecoderTableMips32,instr,local_34,address,(MCRegisterInfo *)info,
                                feature), DVar2 == MCDisassembler_Fail)) {
    return false;
  }
  *size = 4;
  return DVar2 == MCDisassembler_Success;
}

Assistant:

static DecodeStatus Mips64Disassembler_getInstruction(int mode, MCInst *instr,
		const uint8_t *code, size_t code_len,
		uint16_t *Size,
		uint64_t Address, bool isBigEndian, MCRegisterInfo *MRI)
{
	uint32_t Insn;
	DecodeStatus Result;

	if (code_len < 4)
		// not enough data
		return MCDisassembler_Fail;

	if (instr->flat_insn->detail) {
		memset(instr->flat_insn->detail, 0, sizeof(cs_detail));
	}

	Result = readInstruction32((unsigned char*)code, &Insn, isBigEndian, false);
	if (Result == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	if (instr->flat_insn->detail) {
		memset(instr->flat_insn->detail, 0, sizeof(cs_detail));
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction(DecoderTableMips6432, instr, Insn, Address, MRI, mode);
	if (Result != MCDisassembler_Fail) {
		*Size = 4;
		return Result;
	}

	// If we fail to decode in Mips64 decoder space we can try in Mips32
	Result = decodeInstruction(DecoderTableMips32, instr, Insn, Address, MRI, mode);
	if (Result != MCDisassembler_Fail) {
		*Size = 4;
		return Result;
	}

	return MCDisassembler_Fail;
}